

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# helper.cpp
# Opt level: O0

error assemble_float_immediate(context *ctx,token *token,opcode *op,int bits)

{
  long lVar1;
  long lVar2;
  undefined8 uVar3;
  int iVar4;
  undefined4 in_register_0000000c;
  int in_R8D;
  token local_90;
  float local_64;
  undefined1 local_60 [4];
  uint32_t raw;
  byte local_31;
  float local_30;
  int iStack_2c;
  bool negate;
  float value;
  int bits_local;
  opcode *op_local;
  token *token_local;
  context *ctx_local;
  
  _value = (opcode *)CONCAT44(in_register_0000000c,bits);
  iStack_2c = in_R8D;
  op_local = op;
  token_local = token;
  ctx_local = ctx;
  switch(op[1].reuse) {
  case 1:
  case 6:
  case 7:
    local_31 = op[1].reuse == 7;
    if (op[1].reuse != 1) {
      context::tokenize((token *)local_60,(context *)token);
      memcpy(op_local,local_60,0x24);
    }
    iVar4 = equal((token *)op_local,"QNAN");
    if (iVar4 == 0) {
      iVar4 = equal((token *)op_local,"INF");
      if (iVar4 == 0) {
        fail((token *)ctx,(char *)op_local,"expected floating-point literal, QNAN, or INF");
        return (unique_ptr<char[],_std::default_delete<char[]>_>)
               (unique_ptr<char[],_std::default_delete<char[]>_>)ctx;
      }
      local_30 = std::numeric_limits<float>::infinity();
    }
    else {
      local_30 = std::numeric_limits<float>::quiet_NaN();
    }
    if ((local_31 & 1) != 0) {
      local_30 = -local_30;
    }
    break;
  default:
    fail((token *)ctx,(char *)op,"expected floating-point literal, QNAN, or INF");
    return (unique_ptr<char[],_std::default_delete<char[]>_>)
           (unique_ptr<char[],_std::default_delete<char[]>_>)ctx;
  case 4:
    lVar1._0_4_ = op->reuse;
    lVar1._4_4_ = op->sched;
    local_30 = (float)lVar1;
    lVar2._0_4_ = op->reuse;
    lVar2._4_4_ = op->sched;
    if (((float)lVar2 != local_30) || (NAN((float)lVar2) || NAN(local_30))) {
      uVar3._0_4_ = op->reuse;
      uVar3._4_4_ = op->sched;
      fail((token *)ctx,(char *)op,"integer immediate ldcannot be represented as float",uVar3);
      return (unique_ptr<char[],_std::default_delete<char[]>_>)
             (unique_ptr<char[],_std::default_delete<char[]>_>)ctx;
    }
    break;
  case 5:
    local_30 = (float)*(double *)&op->reuse;
  }
  local_64 = local_30;
  if (iStack_2c == 0x14) {
    opcode::add_bits(_value,(ulong)((uint)((int)local_30 << 1) >> 0xd) << 0x14);
    if ((int)local_64 < 0) {
      opcode::add_bits(_value,0x100000000000000);
    }
  }
  else {
    if (iStack_2c != 0x20) {
      __assert_fail("false && \"invalid bits\"",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/ReinUsesLisp[P]nxas/src/helper.cpp"
                    ,0xc4,"error assemble_float_immediate(context &, token &, opcode &, int)");
    }
    opcode::add_bits(_value,(ulong)(uint)local_30 << 0x14);
  }
  context::tokenize(&local_90,(context *)token_local);
  memcpy(op_local,&local_90,0x24);
  memset(ctx,0,8);
  error::error((error *)ctx);
  return (unique_ptr<char[],_std::default_delete<char[]>_>)
         (unique_ptr<char[],_std::default_delete<char[]>_>)ctx;
}

Assistant:

error assemble_float_immediate(context& ctx, token& token, opcode& op, int bits)
{
    static constexpr char MESSAGE[] = "expected floating-point literal, QNAN, or INF";

    float value;
    switch (token.type) {
    case token_type::float_immediate:
        value = token.data.float_immediate;
        break;
    case token_type::immediate:
        value = static_cast<float>(token.data.immediate);
        if (static_cast<int64_t>(token.data.immediate) != value) {
            return fail(token, "integer immediate " PRId64 "cannot be represented as float",
                        token.data.immediate);
        }
        break;
    case token_type::plus:
    case token_type::minus:
    case token_type::identifier: {
        const bool negate = token.type == token_type::minus;
        if (token.type != token_type::identifier) {
            token = ctx.tokenize();
        }
        if (equal(token, "QNAN")) {
            value = std::numeric_limits<float>::quiet_NaN();
        } else if (equal(token, "INF")) {
            value = std::numeric_limits<float>::infinity();
        } else {
            return fail(token, MESSAGE);
        }
        if (negate) {
            value = -value;
        }
        break;
    }
    default:
        return fail(token, MESSAGE);
    }
    uint32_t raw;
    std::memcpy(&raw, &value, sizeof(raw));
    if (bits == 20) {
        // TODO: add a setting to warn/error precision losses
        // if ((raw >> 12) << 12 != raw) ...
        op.add_bits(static_cast<uint64_t>((raw << 1) >> 13) << 20);
        if (raw >> 31 != 0) {
            op.add_bits(1ULL << 56);
        }
    } else if (bits == 32) {
        op.add_bits(static_cast<uint64_t>(raw) << 20);
    } else {
        assert(false && "invalid bits");
    }
    token = ctx.tokenize();
    return {};
}